

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

void __thiscall QMessageLogger::debug(QMessageLogger *this,char *msg,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int backtraceFrames;
  va_list ap;
  QInternalMessageLogContext ctxt;
  QMessageLogContext *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  QInternalMessageLogContext *this_00;
  QMessageLogContext *context;
  QInternalMessageLogContext *pQVar1;
  QtMsgType msgType;
  undefined1 local_268 [16];
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined4 local_238;
  undefined8 local_228;
  undefined8 local_218;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1a0;
  char *local_198;
  int local_17c;
  char *local_178;
  QInternalMessageLogContext *local_170;
  undefined8 local_168;
  undefined1 *puStack_160;
  undefined1 *local_158;
  QInternalMessageLogContext local_148;
  long local_8;
  
  if (in_AL != '\0') {
    local_238 = in_XMM0_Da;
    local_228 = in_XMM1_Qa;
    local_218 = in_XMM2_Qa;
    local_208 = in_XMM3_Qa;
    local_1f8 = in_XMM4_Qa;
    local_1e8 = in_XMM5_Qa;
    local_1d8 = in_XMM6_Qa;
    local_1c8 = in_XMM7_Qa;
  }
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_148;
  local_258 = in_RDX;
  local_250 = in_RCX;
  local_248 = in_R8;
  local_240 = in_R9;
  local_1a0 = in_RSI;
  local_198 = in_RDI;
  memset(this_00,0xaa,0x140);
  pQVar1 = this_00;
  local_178 = in_RDI;
  local_170 = this_00;
  QMessageLogContext::QMessageLogContext(&this_00->super_QMessageLogContext);
  context = (QMessageLogContext *)&pQVar1->backtrace;
  std::optional<QVarLengthArray<void_*,_32LL>_>::optional
            ((optional<QVarLengthArray<void_*,_32LL>_> *)0x240fe9);
  msgType = (QtMsgType)((ulong)pQVar1 >> 0x20);
  local_17c = QInternalMessageLogContext::initFrom
                        ((QInternalMessageLogContext *)
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                         in_stack_fffffffffffffd60);
  if (local_17c != 0) {
    QInternalMessageLogContext::populateBacktrace(this_00,in_stack_fffffffffffffd6c);
  }
  local_158 = local_268;
  puStack_160 = &stack0x00000008;
  local_168 = 0x3000000010;
  qt_message(msgType,context,in_RDI,(__va_list_tag *)this_00);
  QInternalMessageLogContext::~QInternalMessageLogContext((QInternalMessageLogContext *)0x2410e1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageLogger::debug(const char *msg, ...) const
{
    QInternalMessageLogContext ctxt(context);
    va_list ap;
    va_start(ap, msg); // use variable arg list
    qt_message(QtDebugMsg, ctxt, msg, ap);
    va_end(ap);
}